

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int _w;
  Mat *pMVar4;
  int _h;
  size_t sVar5;
  int iVar6;
  int *_doffset_00;
  int iVar7;
  int iVar8;
  int local_1a4;
  int _woffset;
  int local_19c;
  int _outw;
  int _hoffset;
  Mat *local_190;
  int _outh;
  Option *local_180;
  int local_174;
  ulong local_170;
  size_t local_168;
  int _outc;
  int _coffset;
  int _outd;
  int _doffset;
  Mat m;
  Mat bottom_blob_sliced;
  Mat borderm;
  Mat local_78;
  
  local_170 = CONCAT44(local_170._4_4_,bottom_blob->w);
  iVar7 = bottom_blob->h;
  local_174 = bottom_blob->d;
  local_19c = bottom_blob->c;
  iVar6 = bottom_blob->dims;
  local_168 = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  local_190 = top_blob;
  local_180 = opt;
  ncnn::Mat::shape(&bottom_blob_sliced,bottom_blob);
  _doffset_00 = &_doffset;
  resolve_crop_roi(this,&bottom_blob_sliced,&_woffset,&_hoffset,_doffset_00,&_coffset,&_outw,&_outh,
                   &_outd,&_outc);
  ncnn::Mat::~Mat(&bottom_blob_sliced);
  iVar8 = _outd;
  sVar5 = local_168;
  _h = _outh;
  pMVar4 = local_190;
  _w = _outw;
  switch(iVar6) {
  case 1:
    if (_outw != (int)local_170) {
      ncnn::Mat::create(local_190,_outw,local_168,local_180->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      if (sVar5 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar4,0,_woffset);
        return 0;
      }
      if (sVar5 == 2) {
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar4,0,_woffset);
        return 0;
      }
      if (sVar5 == 1) {
        copy_cut_border_image<signed_char>(bottom_blob,pMVar4,0,_woffset);
        return 0;
      }
      return 0;
    }
    break;
  case 2:
    if (iVar7 != _outh || (int)local_170 != _outw) {
      ncnn::Mat::create(local_190,_outw,_outh,local_168,local_180->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      if (sVar5 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar4,_hoffset,_woffset);
        return 0;
      }
      if (sVar5 != 2) {
        if (sVar5 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,pMVar4,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(bottom_blob,pMVar4,_hoffset,_woffset);
      return 0;
    }
    break;
  case 3:
    bVar1 = iVar7 != _outh;
    bVar2 = (int)local_170 != _outw;
    if (_outc != local_19c || (bVar1 || bVar2)) {
      iVar7 = _outc;
      ncnn::Mat::channel_range(&bottom_blob_sliced,bottom_blob,_coffset,_outc);
      pMVar4 = local_190;
      if (bVar1 || bVar2) {
        ncnn::Mat::create(local_190,_w,_h,_outc,local_168,local_180->blob_allocator);
        local_1a4 = -100;
        iVar7 = -100;
        if ((pMVar4->data != (void *)0x0) &&
           (iVar7 = local_1a4, (long)pMVar4->c * pMVar4->cstep != 0)) {
          local_1a4 = 0;
          iVar6 = _outc;
          if (_outc < 1) {
            iVar6 = 0;
          }
          for (iVar8 = 0; iVar7 = local_1a4, iVar6 != iVar8; iVar8 = iVar8 + 1) {
            ncnn::Mat::channel(&m,&bottom_blob_sliced,iVar8);
            ncnn::Mat::channel(&borderm,local_190,iVar8);
            if (local_168 == 4) {
              copy_cut_border_image<float>(&m,&borderm,_hoffset,_woffset);
            }
            else if (local_168 == 2) {
              copy_cut_border_image<unsigned_short>(&m,&borderm,_hoffset,_woffset);
            }
            else if (local_168 == 1) {
              copy_cut_border_image<signed_char>(&m,&borderm,_hoffset,_woffset);
            }
            ncnn::Mat::~Mat(&borderm);
            ncnn::Mat::~Mat(&m);
          }
        }
      }
      else {
        ncnn::Mat::clone(&m,(__fn *)&bottom_blob_sliced,(void *)0x0,iVar7,_doffset_00);
        pMVar4 = local_190;
        ncnn::Mat::operator=(local_190,&m);
        ncnn::Mat::~Mat(&m);
        if ((pMVar4->data == (void *)0x0) ||
           (local_1a4 = 0, iVar7 = local_1a4, (long)pMVar4->c * pMVar4->cstep == 0)) {
          iVar7 = -100;
        }
      }
LAB_001a9d7f:
      local_1a4 = iVar7;
      ncnn::Mat::~Mat(&bottom_blob_sliced);
      return local_1a4;
    }
    break;
  case 4:
    bVar1 = local_174 != _outd;
    bVar2 = iVar7 != _outh;
    bVar3 = (int)local_170 != _outw;
    if (_outc != local_19c || (bVar1 || (bVar2 || bVar3))) {
      iVar7 = _outc;
      ncnn::Mat::channel_range(&bottom_blob_sliced,bottom_blob,_coffset,_outc);
      pMVar4 = local_190;
      if (bVar1 || (bVar2 || bVar3)) {
        ncnn::Mat::create(local_190,_w,_h,iVar8,_outc,local_168,local_180->blob_allocator);
        local_1a4 = -100;
        iVar7 = -100;
        if ((pMVar4->data != (void *)0x0) &&
           (iVar7 = local_1a4, (long)pMVar4->c * pMVar4->cstep != 0)) {
          local_170 = (ulong)(uint)_doffset;
          local_19c = _hoffset;
          local_180 = (Option *)CONCAT44(local_180._4_4_,_woffset);
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          local_1a4 = 0;
          local_174 = _outc;
          if (_outc < 1) {
            local_174 = 0;
          }
          for (iVar6 = 0; iVar7 = local_1a4, iVar6 != local_174; iVar6 = iVar6 + 1) {
            for (iVar7 = 0; iVar8 != iVar7; iVar7 = iVar7 + 1) {
              ncnn::Mat::channel(&borderm,&bottom_blob_sliced,iVar6);
              ncnn::Mat::depth(&m,&borderm,(int)local_170 + iVar7);
              ncnn::Mat::~Mat(&borderm);
              ncnn::Mat::channel(&local_78,local_190,iVar6);
              ncnn::Mat::depth(&borderm,&local_78,iVar7);
              ncnn::Mat::~Mat(&local_78);
              if (local_168 == 4) {
                copy_cut_border_image<float>(&m,&borderm,local_19c,(int)local_180);
              }
              else if (local_168 == 2) {
                copy_cut_border_image<unsigned_short>(&m,&borderm,local_19c,(int)local_180);
              }
              else if (local_168 == 1) {
                copy_cut_border_image<signed_char>(&m,&borderm,local_19c,(int)local_180);
              }
              ncnn::Mat::~Mat(&borderm);
              ncnn::Mat::~Mat(&m);
            }
          }
        }
      }
      else {
        ncnn::Mat::clone(&m,(__fn *)&bottom_blob_sliced,(void *)0x0,iVar7,_doffset_00);
        pMVar4 = local_190;
        ncnn::Mat::operator=(local_190,&m);
        ncnn::Mat::~Mat(&m);
        if ((pMVar4->data == (void *)0x0) ||
           (local_1a4 = 0, iVar7 = local_1a4, (long)pMVar4->c * pMVar4->cstep == 0)) {
          iVar7 = -100;
        }
      }
      goto LAB_001a9d7f;
    }
    break;
  default:
    goto LAB_001a9d90;
  }
  ncnn::Mat::operator=(local_190,bottom_blob);
LAB_001a9d90:
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}